

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_x.hpp
# Opt level: O3

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_X>::eval_exc_vxc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double *eps,double *vrho_a,double *vrho_b,double *vsigma_aa,double *vsigma_ab,
               double *vsigma_bb)

{
  undefined4 extraout_EAX;
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar11 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double __x;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  
  __x = rho_a + rho_b;
  dVar21 = 1.0 / __x;
  dVar17 = rho_a - rho_b;
  dVar5 = cbrt(1e-15);
  dVar6 = cbrt(__x);
  dVar7 = cbrt(rho_a);
  dVar8 = cbrt(rho_b);
  uVar3 = -(ulong)(dVar21 * (rho_a + rho_a) <= 1e-15);
  uVar4 = -(ulong)(dVar21 * (rho_b + rho_b) <= 1e-15);
  auVar19._8_4_ = (int)uVar4;
  auVar19._0_8_ = uVar3;
  auVar19._12_4_ = (int)(uVar4 >> 0x20);
  auVar16._0_8_ = ~uVar3 & (ulong)(1.0 - dVar17 * dVar21);
  auVar16._8_8_ = ~uVar4 & (ulong)(dVar17 * dVar21 + 1.0);
  auVar15._0_8_ = uVar3 & 0x3ffffffffffffffc;
  auVar15._8_8_ = uVar4 & 0x3ffffffffffffffc;
  auVar15 = auVar15 | auVar16;
  auVar11._0_8_ = auVar15._8_8_;
  auVar11._8_4_ = auVar15._0_4_;
  auVar11._12_4_ = auVar15._4_4_;
  dVar22 = (double)(uVar3 & 0x3cd2000000000000 | ~uVar3 & auVar11._0_8_);
  dVar23 = (double)(uVar4 & 0x3cd2000000000000 | ~uVar4 & auVar11._8_8_);
  dVar9 = cbrt(dVar22);
  uVar3 = -(ulong)(dVar22 <= 1e-15);
  uVar4 = -(ulong)(dVar23 <= 1e-15);
  dVar10 = cbrt(dVar23);
  auVar12._0_8_ = dVar7 * dVar7;
  auVar12._8_8_ = dVar8 * dVar8;
  auVar16 = divpd(_DAT_01025040,auVar12);
  auVar13._8_8_ = rho_b * rho_b;
  auVar13._0_8_ = rho_a * rho_a;
  auVar13 = divpd(auVar16,auVar13);
  auVar18._0_8_ = sigma_aa * 0.21733691746289932 * 0.3988851774453903 * auVar13._0_8_;
  auVar18._8_8_ = sigma_bb * 0.21733691746289932 * 0.3988851774453903 * auVar13._8_8_;
  dVar8 = 1.0 / (__x * __x);
  dVar26 = dVar17 * dVar8;
  iVar1 = movmskpd(extraout_EAX,auVar19);
  dVar7 = 0.0;
  bVar2 = iVar1 == 0;
  if (bVar2) {
    dVar7 = dVar21 - dVar26;
  }
  auVar19 = divpd(auVar18,_DAT_01025160);
  dVar8 = dVar8 * -dVar17;
  dVar17 = 0.0;
  if (bVar2) {
    dVar17 = -dVar21 - dVar8;
  }
  auVar20._0_8_ = auVar19._0_8_ + (double)DAT_01025170;
  auVar20._8_8_ = auVar19._8_8_ + DAT_01025170._8_8_;
  dVar14 = 0.0;
  if (bVar2) {
    dVar14 = -dVar21 - dVar26;
  }
  auVar19 = divpd(_DAT_01025170,auVar20);
  dVar26 = 0.0;
  if (bVar2) {
    dVar26 = dVar21 - dVar8;
  }
  dVar8 = (double)((ulong)(dVar5 * 1e-15) & uVar3 | ~uVar3 & (ulong)(dVar22 * dVar9));
  dVar5 = (double)((ulong)(dVar5 * 1e-15) & uVar4 | ~uVar4 & (ulong)(dVar23 * dVar10));
  bVar2 = (uVar3 & 1) == 0;
  dVar21 = 0.0;
  if (bVar2) {
    dVar21 = dVar7 * dVar9 * 1.3333333333333333;
  }
  dVar22 = 1.0 / (dVar6 * dVar6);
  dVar7 = 0.0;
  if (bVar2) {
    dVar7 = dVar14 * dVar9 * 1.3333333333333333;
  }
  dVar23 = dVar6 * dVar8;
  dVar14 = dVar6 * dVar5;
  dVar24 = ((double)DAT_01025040 - auVar19._0_8_) * (double)DAT_01025170 + (double)DAT_01025040;
  dVar25 = (DAT_01025040._8_8_ - auVar19._8_8_) * DAT_01025170._8_8_ + DAT_01025040._8_8_;
  bVar2 = (uVar4 & 1) == 0;
  dVar9 = 0.0;
  if (bVar2) {
    dVar9 = dVar17 * dVar10 * 1.3333333333333333;
  }
  dVar17 = 0.0;
  if (bVar2) {
    dVar17 = dVar26 * dVar10 * 1.3333333333333333;
  }
  dVar10 = (1.0 / (auVar20._0_8_ * auVar20._0_8_)) * 0.2195149727645171;
  dVar26 = dVar23 * 0.6464160000000001 * 0.9847450218426964;
  dVar27 = dVar8 * dVar22 * 0.9847450218426964 * dVar24 * -0.125;
  bVar2 = (-(ulong)(rho_a <= 1e-32) & 1) == 0;
  dVar8 = 0.0;
  if (bVar2) {
    dVar8 = (dVar10 * 1.8171205928321397 * sigma_aa * 0.21733691746289932 *
             (auVar16._0_8_ / (rho_a * rho_a * rho_a)) * dVar26) / 24.0 +
            dVar21 * dVar6 * -0.36927938319101117 * dVar24 + dVar27;
  }
  dVar21 = 0.0;
  if (bVar2) {
    dVar21 = dVar7 * dVar6 * -0.36927938319101117 * dVar24 + dVar27;
  }
  dVar7 = 0.0;
  if (bVar2) {
    dVar7 = -dVar26 * dVar10 * 0.3949273883044934 * auVar13._0_8_ * 0.015625;
  }
  dVar22 = dVar22 * dVar5 * 0.9847450218426964 * dVar25 * -0.125;
  bVar2 = (-(ulong)(rho_b <= 1e-32) & 1) == 0;
  dVar5 = 0.0;
  if (bVar2) {
    dVar5 = dVar9 * dVar6 * -0.36927938319101117 * dVar25 + dVar22;
  }
  dVar9 = (1.0 / (auVar20._8_8_ * auVar20._8_8_)) * 0.2195149727645171;
  dVar26 = dVar14 * 0.6464160000000001 * 0.9847450218426964;
  dVar10 = 0.0;
  if (bVar2) {
    dVar10 = ((auVar16._8_8_ / (rho_b * rho_b * rho_b)) *
              dVar9 * 1.8171205928321397 * sigma_bb * 0.21733691746289932 * dVar26) / 24.0 +
             dVar6 * dVar17 * -0.36927938319101117 * dVar25 + dVar22;
  }
  dVar6 = 0.0;
  if (bVar2) {
    dVar6 = -dVar26 * auVar13._8_8_ * dVar9 * 0.3949273883044934 * 0.015625;
  }
  dVar22 = (double)(~-(ulong)(rho_b <= 1e-32) & (ulong)(dVar14 * -0.36927938319101117 * dVar25)) +
           (double)(~-(ulong)(rho_a <= 1e-32) & (ulong)(dVar23 * -0.36927938319101117 * dVar24));
  *eps = dVar22;
  *vrho_a = (dVar5 + dVar8) * __x + dVar22;
  *vrho_b = (dVar21 + dVar10) * __x + dVar22;
  *vsigma_aa = dVar7 * __x;
  *vsigma_ab = 0.0;
  *vsigma_bb = dVar6 * __x;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double& eps, double& vrho_a, double& vrho_b, double& vsigma_aa, double& vsigma_ab, double& vsigma_bb ) {

    (void)(sigma_ab);
    (void)(eps);
    constexpr double t2 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_pi;
    constexpr double t28 = constants::m_cbrt_6;
    constexpr double t31 = constants::m_cbrt_pi_sq;
    constexpr double t5 = t2 / t3;
    constexpr double t29 = mu * t28;
    constexpr double t32 = t31 * t31;
    constexpr double t33 = 0.1e1 / t32;
    constexpr double t100 = kappa * kappa;
    constexpr double t171 = t28 * t33;


    const double t1 = rho_a <= dens_tol;
    const double t6 = rho_a + rho_b;
    const double t7 = 0.1e1 / t6;
    const double t10 = 0.2e1 * rho_a * t7 <= zeta_tol;
    const double t11 = zeta_tol - 0.1e1;
    const double t14 = 0.2e1 * rho_b * t7 <= zeta_tol;
    const double t15 = -t11;
    const double t16 = rho_a - rho_b;
    const double t18 = piecewise_functor_5( t10, t11, t14, t15, t16 * t7 );
    const double t19 = 0.1e1 + t18;
    const double t20 = t19 <= zeta_tol;
    const double t21 = safe_math::cbrt( zeta_tol );
    const double t22 = t21 * zeta_tol;
    const double t23 = safe_math::cbrt( t19 );
    const double t25 = piecewise_functor_3( t20, t22, t23 * t19 );
    const double t26 = safe_math::cbrt( t6 );
    const double t27 = t25 * t26;
    const double t34 = t33 * sigma_aa;
    const double t35 = rho_a * rho_a;
    const double t36 = safe_math::cbrt( rho_a );
    const double t37 = t36 * t36;
    const double t39 = 0.1e1 / t37 / t35;
    const double t43 = kappa + t29 * t34 * t39 / 0.24e2;
    const double t48 = 0.1e1 + kappa * ( 0.1e1 - kappa / t43 );
    const double t52 = piecewise_functor_3( t1, 0.0, -0.3e1 / 0.8e1 * t5 * t27 * t48 );
    const double t53 = rho_b <= dens_tol;
    const double t54 = -t16;
    const double t56 = piecewise_functor_5( t14, t11, t10, t15, t54 * t7 );
    const double t57 = 0.1e1 + t56;
    const double t58 = t57 <= zeta_tol;
    const double t59 = safe_math::cbrt( t57 );
    const double t61 = piecewise_functor_3( t58, t22, t59 * t57 );
    const double t62 = t61 * t26;
    const double t63 = t33 * sigma_bb;
    const double t64 = rho_b * rho_b;
    const double t65 = safe_math::cbrt( rho_b );
    const double t66 = t65 * t65;
    const double t68 = 0.1e1 / t66 / t64;
    const double t72 = kappa + t29 * t63 * t68 / 0.24e2;
    const double t77 = 0.1e1 + kappa * ( 0.1e1 - kappa / t72 );
    const double t81 = piecewise_functor_3( t53, 0.0, -0.3e1 / 0.8e1 * t5 * t62 * t77 );
    const double t82 = t6 * t6;
    const double t83 = 0.1e1 / t82;
    const double t84 = t16 * t83;
    const double t86 = piecewise_functor_5( t10, 0.0, t14, 0.0, t7 - t84 );
    const double t89 = piecewise_functor_3( t20, 0.0, 0.4e1 / 0.3e1 * t23 * t86 );
    const double t90 = t89 * t26;
    const double t94 = t26 * t26;
    const double t95 = 0.1e1 / t94;
    const double t96 = t25 * t95;
    const double t99 = t5 * t96 * t48 / 0.8e1;
    const double t101 = t27 * t100;
    const double t102 = t5 * t101;
    const double t103 = t43 * t43;
    const double t105 = 0.1e1 / t103 * mu;
    const double t106 = t105 * t28;
    const double t107 = t35 * rho_a;
    const double t109 = 0.1e1 / t37 / t107;
    const double t111 = t106 * t34 * t109;
    const double t115 = piecewise_functor_3( t1, 0.0, -0.3e1 / 0.8e1 * t5 * t90 * t48 - t99 + t102 * t111 / 0.24e2 );
    const double t116 = t54 * t83;
    const double t118 = piecewise_functor_5( t14, 0.0, t10, 0.0, -t7 - t116 );
    const double t121 = piecewise_functor_3( t58, 0.0, 0.4e1 / 0.3e1 * t59 * t118 );
    const double t122 = t121 * t26;
    const double t126 = t61 * t95;
    const double t129 = t5 * t126 * t77 / 0.8e1;
    const double t131 = piecewise_functor_3( t53, 0.0, -0.3e1 / 0.8e1 * t5 * t122 * t77 - t129 );
    const double t135 = piecewise_functor_5( t10, 0.0, t14, 0.0, -t7 - t84 );
    const double t138 = piecewise_functor_3( t20, 0.0, 0.4e1 / 0.3e1 * t23 * t135 );
    const double t139 = t138 * t26;
    const double t144 = piecewise_functor_3( t1, 0.0, -0.3e1 / 0.8e1 * t5 * t139 * t48 - t99 );
    const double t146 = piecewise_functor_5( t14, 0.0, t10, 0.0, t7 - t116 );
    const double t149 = piecewise_functor_3( t58, 0.0, 0.4e1 / 0.3e1 * t59 * t146 );
    const double t150 = t149 * t26;
    const double t154 = t62 * t100;
    const double t155 = t5 * t154;
    const double t156 = t72 * t72;
    const double t158 = 0.1e1 / t156 * mu;
    const double t159 = t158 * t28;
    const double t160 = t64 * rho_b;
    const double t162 = 0.1e1 / t66 / t160;
    const double t164 = t159 * t63 * t162;
    const double t168 = piecewise_functor_3( t53, 0.0, -0.3e1 / 0.8e1 * t5 * t150 * t77 - t129 + t155 * t164 / 0.24e2 );
    const double t173 = t105 * t171 * t39;
    const double t176 = piecewise_functor_3( t1, 0.0, -t102 * t173 / 0.64e2 );
    const double t178 = t158 * t171 * t68;
    const double t181 = piecewise_functor_3( t53, 0.0, -t155 * t178 / 0.64e2 );


    eps = t52 + t81;
    vrho_a = t52 + t81 + t6 * ( t115 + t131 );
    vrho_b = t52 + t81 + t6 * ( t144 + t168 );
    vsigma_aa = t6 * t176;
    vsigma_ab = 0.e0;
    vsigma_bb = t6 * t181;

  }